

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

int __thiscall
QTreeViewPrivate::select
          (QTreeViewPrivate *this,int __nfds,fd_set *__readfds,fd_set *__writefds,
          fd_set *__exceptfds,timeval *__timeout)

{
  int acolumn;
  int acolumn_00;
  QAbstractItemView *this_00;
  QTreeViewItem *pQVar1;
  QAbstractItemModel *pQVar2;
  QPersistentModelIndexData *pQVar3;
  QPersistentModelIndexData *pQVar4;
  QPersistentModelIndex QVar5;
  QPersistentModelIndex QVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  QItemSelectionModel *pQVar13;
  uint uVar14;
  pair<int,_int> *ppVar15;
  int i;
  ulong uVar16;
  undefined4 in_register_00000034;
  uint uVar17;
  long lVar18;
  long in_FS_OFFSET;
  QModelIndex ret;
  QModelIndex local_170;
  undefined8 local_158;
  QPersistentModelIndexData *pQStack_150;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_148;
  QItemSelectionRange local_138;
  undefined8 local_128;
  QPersistentModelIndexData *pQStack_120;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_118;
  undefined8 local_108;
  QPersistentModelIndexData *pQStack_100;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_f8;
  QPersistentModelIndexData *local_e8;
  QPersistentModelIndexData *pQStack_e0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_d8;
  QArrayDataPointer<QItemSelectionRange> local_c8;
  QItemSelectionRange local_a8;
  QPersistentModelIndexData *local_98;
  QPersistentModelIndexData *pQStack_90;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_88;
  QArrayDataPointer<std::pair<int,_int>_> local_78;
  QArrayDataPointer<QItemSelectionRange> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemView **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  local_58.d = (Data *)0x0;
  local_58.ptr = (QItemSelectionRange *)0x0;
  local_58.size = 0;
  uVar8 = viewIndex(this,(QModelIndex *)CONCAT44(in_register_00000034,__nfds));
  iVar9 = viewIndex(this,(QModelIndex *)__readfds);
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (pair<int,_int> *)&DAT_aaaaaaaaaaaaaaaa;
  columnRanges((QList<std::pair<int,_int>_> *)&local_78,this,
               (QModelIndex *)CONCAT44(in_register_00000034,__nfds),(QModelIndex *)__readfds);
  ppVar15 = local_78.ptr;
  do {
    if (ppVar15 == local_78.ptr + local_78.size) {
      pQVar13 = QAbstractItemView::selectionModel(this_00);
      (**(code **)(*(long *)pQVar13 + 0x70))(pQVar13,&local_58,(int)__writefds);
      QArrayDataPointer<std::pair<int,_int>_>::~QArrayDataPointer(&local_78);
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return (int)*(long *)(in_FS_OFFSET + 0x28);
      }
      __stack_chk_fail();
    }
    acolumn = ppVar15->first;
    acolumn_00 = ppVar15->second;
    local_98 = (QPersistentModelIndexData *)0xffffffffffffffff;
    pQStack_90 = (QPersistentModelIndexData *)0x0;
    tStack_88.ptr = (QAbstractItemModel *)0x0;
    local_a8.tl.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    local_a8.br.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    QItemSelectionRange::QItemSelectionRange(&local_a8);
    local_c8.d = (Data *)0x0;
    local_c8.ptr = (QItemSelectionRange *)0x0;
    local_c8.size = 0;
    for (uVar17 = uVar8; (int)uVar17 <= iVar9; uVar17 = uVar17 + 1) {
      if (((int)uVar17 < 0) || (uVar16 = (ulong)uVar17, (ulong)(this->viewItems).d.size <= uVar16))
      {
        local_e8 = (QPersistentModelIndexData *)0xffffffffffffffff;
        pQStack_e0 = (QPersistentModelIndexData *)0x0;
        local_d8.ptr = (QAbstractItemModel *)0x0;
      }
      else {
        pQVar1 = (this->viewItems).d.ptr;
        local_d8.ptr = pQVar1[uVar16].index.m.ptr;
        pQVar1 = pQVar1 + uVar16;
        local_e8 = *(QPersistentModelIndexData **)&pQVar1->index;
        pQStack_e0 = (QPersistentModelIndexData *)(pQVar1->index).i;
      }
      local_f8.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_108 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_100 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
      QModelIndex::parent((QModelIndex *)&local_108,(QModelIndex *)&local_e8);
      local_118.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_128 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_120 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
      QModelIndex::parent((QModelIndex *)&local_128,(QModelIndex *)&local_98);
      if ((((int)local_98 < 0) || ((long)local_98 < 0)) ||
         (tStack_88.ptr == (QAbstractItemModel *)0x0)) {
LAB_0054609d:
        bVar7 = QItemSelectionRange::isValid(&local_a8);
        if (bVar7) {
          QList<QItemSelectionRange>::emplaceBack<QItemSelectionRange_const&>
                    ((QList<QItemSelectionRange> *)&local_58,&local_a8);
        }
        if (local_c8.size == 0) {
          QModelIndex::sibling
                    ((QModelIndex *)&local_158,(QModelIndex *)&local_e8,(int)local_e8,acolumn);
          QModelIndex::sibling(&local_170,(QModelIndex *)&local_e8,(int)local_e8,acolumn_00);
          QItemSelectionRange::QItemSelectionRange(&local_138,(QModelIndex *)&local_158,&local_170);
          QVar6.d = local_a8.br.d;
          QVar5.d = local_a8.tl.d;
          local_a8.tl.d = local_138.tl.d;
          local_a8.br.d = local_138.br.d;
          local_138.tl.d = QVar5.d;
          local_138.br.d = QVar6.d;
LAB_005461bf:
          QItemSelectionRange::~QItemSelectionRange(&local_138);
        }
        else {
          QList<QItemSelectionRange>::takeLast((QList<QItemSelectionRange> *)&local_158);
          QVar6.d = local_a8.br.d;
          QVar5.d = local_a8.tl.d;
          local_a8.tl.d = local_158;
          local_a8.br.d = pQStack_150;
          local_158 = QVar5.d;
          pQStack_150 = QVar6.d;
          QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)&local_158);
          QPersistentModelIndex::operator_cast_to_QModelIndex
                    ((QModelIndex *)&local_158,&local_a8.br);
          local_d8.ptr = local_148.ptr;
          local_e8 = local_158;
          pQStack_e0 = pQStack_150;
          uVar17 = uVar17 - 1;
        }
      }
      else {
        if ((((int)local_108 != (int)local_128) || (local_108._4_4_ != local_128._4_4_)) ||
           ((pQStack_100 != pQStack_120 || (local_f8.ptr != local_118.ptr)))) {
          pQVar2 = (this->super_QAbstractItemViewPrivate).model;
          (**(code **)(*(long *)pQVar2 + 0x60))
                    ((QModelIndex *)&local_158,pQVar2,(ulong)local_98 & 0xffffffff,0,
                     (QModelIndex *)&local_128);
          if ((((int)local_108 != (int)local_158) || (local_108._4_4_ != local_158._4_4_)) ||
             ((pQStack_100 != pQStack_150 || (local_f8.ptr != local_148.ptr)))) goto LAB_0054609d;
          QList<QItemSelectionRange>::emplaceBack<QItemSelectionRange_const&>
                    ((QList<QItemSelectionRange> *)&local_c8,&local_a8);
          QModelIndex::sibling
                    ((QModelIndex *)&local_158,(QModelIndex *)&local_e8,(int)local_e8,acolumn);
          QModelIndex::sibling(&local_170,(QModelIndex *)&local_e8,(int)local_e8,acolumn_00);
LAB_00546385:
          QItemSelectionRange::QItemSelectionRange(&local_138,(QModelIndex *)&local_158,&local_170);
          pQVar3 = local_138.tl.d;
          pQVar4 = local_138.br.d;
          local_138.tl.d = local_a8.tl.d;
          local_138.br.d = local_a8.br.d;
          local_a8.tl.d = pQVar3;
          local_a8.br.d = pQVar4;
          goto LAB_005461bf;
        }
        uVar14 = (int)local_98 - (int)local_e8;
        uVar10 = -uVar14;
        if (0 < (int)uVar14) {
          uVar10 = uVar14;
        }
        if (uVar10 < 2) {
          local_148.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          local_158 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
          pQStack_150 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
          pQVar2 = (this->super_QAbstractItemViewPrivate).model;
          uVar11 = QPersistentModelIndex::row();
          uVar12 = QPersistentModelIndex::column();
          QPersistentModelIndex::parent();
          (**(code **)(*(long *)pQVar2 + 0x60))
                    ((QModelIndex *)&local_158,pQVar2,uVar11,uVar12,&local_170);
          QModelIndex::sibling(&local_170,(QModelIndex *)&local_e8,(int)local_e8,acolumn_00);
          goto LAB_00546385;
        }
        bVar7 = QItemSelectionRange::isValid(&local_a8);
        if (bVar7) {
          QList<QItemSelectionRange>::emplaceBack<QItemSelectionRange_const&>
                    ((QList<QItemSelectionRange> *)&local_58,&local_a8);
        }
        QModelIndex::sibling
                  ((QModelIndex *)&local_158,(QModelIndex *)&local_e8,(int)local_e8,acolumn);
        QModelIndex::sibling(&local_170,(QModelIndex *)&local_e8,(int)local_e8,acolumn_00);
        QItemSelectionRange::QItemSelectionRange(&local_138,(QModelIndex *)&local_158,&local_170);
        QVar6.d = local_a8.br.d;
        QVar5.d = local_a8.tl.d;
        local_a8.tl.d = local_138.tl.d;
        local_a8.br.d = local_138.br.d;
        local_138.tl.d = QVar5.d;
        local_138.br.d = QVar6.d;
        QItemSelectionRange::~QItemSelectionRange(&local_138);
      }
      tStack_88.ptr = local_d8.ptr;
      local_98 = local_e8;
      pQStack_90 = pQStack_e0;
    }
    bVar7 = QItemSelectionRange::isValid(&local_a8);
    if (bVar7) {
      QList<QItemSelectionRange>::emplaceBack<QItemSelectionRange_const&>
                ((QList<QItemSelectionRange> *)&local_58,&local_a8);
    }
    lVar18 = 0;
    for (uVar16 = 0; uVar16 < (ulong)local_c8.size; uVar16 = uVar16 + 1) {
      QList<QItemSelectionRange>::emplaceBack<QItemSelectionRange_const&>
                ((QList<QItemSelectionRange> *)&local_58,
                 (QItemSelectionRange *)((long)&((local_c8.ptr)->tl).d + lVar18));
      lVar18 = lVar18 + 0x10;
    }
    QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_c8);
    QItemSelectionRange::~QItemSelectionRange(&local_a8);
    ppVar15 = ppVar15 + 1;
  } while( true );
}

Assistant:

void QTreeViewPrivate::select(const QModelIndex &topIndex, const QModelIndex &bottomIndex,
                              QItemSelectionModel::SelectionFlags command)
{
    Q_Q(QTreeView);
    QItemSelection selection;
    const int top = viewIndex(topIndex),
        bottom = viewIndex(bottomIndex);

    const QList<std::pair<int, int>> colRanges = columnRanges(topIndex, bottomIndex);
    QList<std::pair<int, int>>::const_iterator it;
    for (it = colRanges.begin(); it != colRanges.end(); ++it) {
        const int left = (*it).first,
            right = (*it).second;

        QModelIndex previous;
        QItemSelectionRange currentRange;
        QStack<QItemSelectionRange> rangeStack;
        for (int i = top; i <= bottom; ++i) {
            QModelIndex index = modelIndex(i);
            QModelIndex parent = index.parent();
            QModelIndex previousParent = previous.parent();
            if (previous.isValid() && parent == previousParent) {
                // same parent
                if (qAbs(previous.row() - index.row()) > 1) {
                    //a hole (hidden index inside a range) has been detected
                    if (currentRange.isValid()) {
                        selection.append(currentRange);
                    }
                    //let's start a new range
                    currentRange = QItemSelectionRange(index.sibling(index.row(), left), index.sibling(index.row(), right));
                } else {
                    QModelIndex tl = model->index(currentRange.top(), currentRange.left(),
                        currentRange.parent());
                    currentRange = QItemSelectionRange(tl, index.sibling(index.row(), right));
                }
            } else if (previous.isValid() && parent == model->index(previous.row(), 0, previousParent)) {
                // item is child of previous
                rangeStack.push(currentRange);
                currentRange = QItemSelectionRange(index.sibling(index.row(), left), index.sibling(index.row(), right));
            } else {
                if (currentRange.isValid())
                    selection.append(currentRange);
                if (rangeStack.isEmpty()) {
                    currentRange = QItemSelectionRange(index.sibling(index.row(), left), index.sibling(index.row(), right));
                } else {
                    currentRange = rangeStack.pop();
                    index = currentRange.bottomRight(); //let's resume the range
                    --i; //we process again the current item
                }
            }
            previous = index;
        }
        if (currentRange.isValid())
            selection.append(currentRange);
        for (int i = 0; i < rangeStack.size(); ++i)
            selection.append(rangeStack.at(i));
    }
    q->selectionModel()->select(selection, command);
}